

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitSIMDTernary(BinaryInstWriter *this,SIMDTernary *curr)

{
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> local_1c;
  
  local_1c.value._0_1_ = 0xfd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  switch(curr->op) {
  case Bitselect:
    __fd = (int)this->o;
    local_1c.value = 0x52;
    break;
  case RelaxedMaddVecF16x8:
    __fd = (int)this->o;
    local_1c.value = 0x14e;
    break;
  case RelaxedNmaddVecF16x8:
    __fd = (int)this->o;
    local_1c.value = 0x14f;
    break;
  case RelaxedMaddVecF32x4:
    __fd = (int)this->o;
    local_1c.value = 0x105;
    break;
  case RelaxedNmaddVecF32x4:
    __fd = (int)this->o;
    local_1c.value = 0x106;
    break;
  case RelaxedMaddVecF64x2:
    __fd = (int)this->o;
    local_1c.value = 0x107;
    break;
  case RelaxedNmaddVecF64x2:
    __fd = (int)this->o;
    local_1c.value = 0x108;
    break;
  case LaneselectI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x109;
    break;
  case LaneselectI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x10a;
    break;
  case LaneselectI32x4:
    __fd = (int)this->o;
    local_1c.value = 0x10b;
    break;
  case LaneselectI64x2:
    __fd = (int)this->o;
    local_1c.value = 0x10c;
    break;
  case DotI8x16I7x16AddSToVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0x113;
    break;
  default:
    goto switchD_00cab6a7_default;
  }
  LEB<unsigned_int,_unsigned_char>::write(&local_1c,__fd,__buf,0xe53508);
switchD_00cab6a7_default:
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDTernary(SIMDTernary* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case Bitselect:
      o << U32LEB(BinaryConsts::V128Bitselect);
      break;
    case LaneselectI8x16:
      o << U32LEB(BinaryConsts::I8x16Laneselect);
      break;
    case LaneselectI16x8:
      o << U32LEB(BinaryConsts::I16x8Laneselect);
      break;
    case LaneselectI32x4:
      o << U32LEB(BinaryConsts::I32x4Laneselect);
      break;
    case LaneselectI64x2:
      o << U32LEB(BinaryConsts::I64x2Laneselect);
      break;
    case RelaxedMaddVecF16x8:
      o << U32LEB(BinaryConsts::F16x8RelaxedMadd);
      break;
    case RelaxedNmaddVecF16x8:
      o << U32LEB(BinaryConsts::F16x8RelaxedNmadd);
      break;
    case RelaxedMaddVecF32x4:
      o << U32LEB(BinaryConsts::F32x4RelaxedMadd);
      break;
    case RelaxedNmaddVecF32x4:
      o << U32LEB(BinaryConsts::F32x4RelaxedNmadd);
      break;
    case RelaxedMaddVecF64x2:
      o << U32LEB(BinaryConsts::F64x2RelaxedMadd);
      break;
    case RelaxedNmaddVecF64x2:
      o << U32LEB(BinaryConsts::F64x2RelaxedNmadd);
      break;
    case DotI8x16I7x16AddSToVecI32x4:
      o << U32LEB(BinaryConsts::I32x4DotI8x16I7x16AddS);
      break;
  }
}